

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RTCRayQueryFlags RVar1;
  RTCFeatureFlags RVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  BVH *bvh;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  vfloat_impl<4> vVar12;
  vfloat_impl<4> vVar13;
  undefined1 auVar14 [16];
  RTCIntersectArguments *pRVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [12];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  bool bVar51;
  uint uVar52;
  undefined4 uVar53;
  int iVar54;
  AABBNodeMB4D *node1;
  ulong uVar55;
  RTCIntersectArguments *pRVar56;
  ulong uVar57;
  RTCIntersectArguments *pRVar58;
  RTCIntersectArguments *pRVar59;
  uint uVar60;
  long lVar61;
  long lVar62;
  QuadMesh *mesh;
  size_t sVar63;
  ulong uVar64;
  long lVar65;
  vuint<4> *v;
  NodeRef *pNVar66;
  NodeRef root;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar98;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  float fVar96;
  float fVar97;
  undefined1 in_ZMM0 [64];
  float fVar99;
  float fVar100;
  undefined1 auVar101 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar115;
  float fVar117;
  undefined1 auVar114 [64];
  vint4 ai_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar149;
  float fVar166;
  float fVar167;
  vint4 ai;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar184;
  float fVar186;
  vint4 ai_1;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar183 [16];
  vint4 ai_3;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  vint4 bi;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  vint4 bi_1;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  vint4 bi_3;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  vint4 bi_2;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar234;
  float fVar237;
  float fVar238;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar239;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 local_3938 [8];
  float fStack_3930;
  float fStack_392c;
  Vec3<embree::vfloat_impl<4>_> p1;
  Precalculations pre;
  undefined1 local_38c8 [8];
  float fStack_38c0;
  float fStack_38bc;
  undefined1 local_38a8 [8];
  float fStack_38a0;
  float fStack_389c;
  undefined1 local_3898 [16];
  RTCIntersectArguments *local_3880;
  RTCIntersectArguments *local_3878;
  int local_386c;
  undefined1 local_3868 [16];
  undefined1 local_3858 [8];
  float fStack_3850;
  float fStack_384c;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_37a8 [16];
  undefined1 local_3778 [8];
  float fStack_3770;
  float fStack_376c;
  undefined1 local_3768 [8];
  float fStack_3760;
  float fStack_375c;
  undefined1 local_3758 [8];
  float fStack_3750;
  float fStack_374c;
  float local_3728;
  float fStack_3724;
  float fStack_3720;
  vint<4> itime;
  undefined8 local_36c8;
  undefined8 uStack_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  vfloat<4> t;
  vfloat<4> v_1;
  vfloat<4> u;
  TravRayK<4,_true> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  uVar25 = mm_lookupmask_ps._248_8_;
  uVar24 = mm_lookupmask_ps._240_8_;
  uVar23 = mm_lookupmask_ps._8_8_;
  uVar22 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar163 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar101 = vpcmpeqd_avx(auVar163,(undefined1  [16])valid_i->field_0);
    auVar82 = ZEXT816(0) << 0x40;
    auVar14 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar82,5);
    auVar146 = auVar101 & auVar14;
    if ((((auVar146 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar146 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar146 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar146[0xf] < '\0'
       ) {
      auVar14 = vandps_avx(auVar14,auVar101);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar240._8_4_ = 0x7fffffff;
      auVar240._0_8_ = 0x7fffffff7fffffff;
      auVar240._12_4_ = 0x7fffffff;
      auVar101 = vandps_avx(auVar240,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar226._8_4_ = 0x219392ef;
      auVar226._0_8_ = 0x219392ef219392ef;
      auVar226._12_4_ = 0x219392ef;
      auVar146 = vcmpps_avx(auVar101,auVar226,1);
      auVar245._8_4_ = 0x3f800000;
      auVar245._0_8_ = 0x3f8000003f800000;
      auVar245._12_4_ = 0x3f800000;
      auVar190 = vdivps_avx(auVar245,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar101 = vandps_avx(auVar240,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar157 = vcmpps_avx(auVar101,auVar226,1);
      auVar191 = vdivps_avx(auVar245,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar101 = vandps_avx(auVar240,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar101 = vcmpps_avx(auVar101,auVar226,1);
      auVar227._8_4_ = 0x5d5e0b6b;
      auVar227._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar227._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar190,auVar227,auVar146);
      auVar146 = vdivps_avx(auVar245,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar191,auVar227,auVar157);
      tray.rdir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar146,auVar227,auVar101);
      auVar101 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar82,1);
      auVar190._8_4_ = 0x20;
      auVar190._0_8_ = 0x2000000020;
      auVar190._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar101,auVar190);
      auVar101 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar82,5);
      auVar146._8_4_ = 0x40;
      auVar146._0_8_ = 0x4000000040;
      auVar146._12_4_ = 0x40;
      auVar191._8_4_ = 0x60;
      auVar191._0_8_ = 0x6000000060;
      auVar191._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar191,auVar146,auVar101);
      auVar101 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar82,5);
      auVar157._8_4_ = 0x80;
      auVar157._0_8_ = 0x8000000080;
      auVar157._12_4_ = 0x80;
      auVar192._8_4_ = 0xa0;
      auVar192._0_8_ = 0xa0000000a0;
      auVar192._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar192,auVar157,auVar101);
      auVar101 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar82);
      auVar146 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar82);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar252 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar101,auVar14);
      auVar114 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar101._8_4_ = 0xff800000;
      auVar101._0_8_ = 0xff800000ff800000;
      auVar101._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar101,auVar146,auVar14);
      terminated.field_0.i[1] = auVar14._4_4_ ^ auVar163._4_4_;
      terminated.field_0.i[0] = auVar14._0_4_ ^ auVar163._0_4_;
      terminated.field_0.i[2] = auVar14._8_4_ ^ auVar163._8_4_;
      terminated.field_0.i[3] = auVar14._12_4_ ^ auVar163._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar60 = 3;
      }
      else {
        uVar60 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_3880 = (RTCIntersectArguments *)(ray + 0x80);
      pNVar66 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar67 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_0164284b:
      do {
        do {
          root.ptr = pNVar66[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0164427c;
          pNVar66 = pNVar66 + -1;
          paVar67 = paVar67 + -1;
          aVar102 = *paVar67;
          auVar163 = vcmpps_avx((undefined1  [16])aVar102,(undefined1  [16])tray.tfar.field_0,1);
          uVar52 = vmovmskps_avx(auVar163);
        } while (uVar52 == 0);
        uVar55 = (ulong)(uVar52 & 0xff);
        uVar52 = POPCOUNT(uVar52 & 0xff);
        if (uVar60 < uVar52) {
LAB_0164288e:
          do {
            uVar52 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0164427c;
              auVar163 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar102,6)
              ;
              if ((((auVar163 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar163 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar163 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar163[0xf]) goto LAB_0164284b;
              pRVar56 = (RTCIntersectArguments *)((ulong)(uVar52 & 0xf) - 8);
              auVar163 = vpcmpeqd_avx(auVar163,auVar163);
              pRVar59 = (RTCIntersectArguments *)0x0;
              pRVar58 = pRVar56;
              local_37a8 = auVar163 ^ (undefined1  [16])terminated.field_0;
              goto LAB_01642b55;
            }
            uVar55 = root.ptr & 0xfffffffffffffff0;
            auVar163 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar102,6);
            root.ptr = 8;
            aVar102 = auVar252._0_16_;
            for (lVar61 = -0x20;
                (lVar61 != 0 && (sVar63 = *(size_t *)(uVar55 + 0x40 + lVar61 * 2), sVar63 != 8));
                lVar61 = lVar61 + 4) {
              uVar53 = *(undefined4 *)(uVar55 + 0x120 + lVar61);
              auVar121._4_4_ = uVar53;
              auVar121._0_4_ = uVar53;
              auVar121._8_4_ = uVar53;
              auVar121._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar55 + 0x60 + lVar61);
              auVar150._4_4_ = uVar53;
              auVar150._0_4_ = uVar53;
              auVar150._8_4_ = uVar53;
              auVar150._12_4_ = uVar53;
              auVar101 = *(undefined1 (*) [16])(ray + 0x70);
              auVar146 = vfmadd231ps_fma(auVar150,auVar101,auVar121);
              uVar53 = *(undefined4 *)(uVar55 + 0x160 + lVar61);
              auVar122._4_4_ = uVar53;
              auVar122._0_4_ = uVar53;
              auVar122._8_4_ = uVar53;
              auVar122._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar55 + 0xa0 + lVar61);
              auVar171._4_4_ = uVar53;
              auVar171._0_4_ = uVar53;
              auVar171._8_4_ = uVar53;
              auVar171._12_4_ = uVar53;
              auVar82 = vfmadd231ps_fma(auVar171,auVar101,auVar122);
              uVar53 = *(undefined4 *)(uVar55 + 0x1a0 + lVar61);
              auVar123._4_4_ = uVar53;
              auVar123._0_4_ = uVar53;
              auVar123._8_4_ = uVar53;
              auVar123._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar55 + 0xe0 + lVar61);
              auVar193._4_4_ = uVar53;
              auVar193._0_4_ = uVar53;
              auVar193._8_4_ = uVar53;
              auVar193._12_4_ = uVar53;
              auVar157 = vfmadd231ps_fma(auVar193,auVar101,auVar123);
              uVar53 = *(undefined4 *)(uVar55 + 0x140 + lVar61);
              auVar124._4_4_ = uVar53;
              auVar124._0_4_ = uVar53;
              auVar124._8_4_ = uVar53;
              auVar124._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar55 + 0x80 + lVar61);
              auVar201._4_4_ = uVar53;
              auVar201._0_4_ = uVar53;
              auVar201._8_4_ = uVar53;
              auVar201._12_4_ = uVar53;
              auVar190 = vfmadd231ps_fma(auVar201,auVar101,auVar124);
              uVar53 = *(undefined4 *)(uVar55 + 0x180 + lVar61);
              auVar125._4_4_ = uVar53;
              auVar125._0_4_ = uVar53;
              auVar125._8_4_ = uVar53;
              auVar125._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar55 + 0xc0 + lVar61);
              auVar210._4_4_ = uVar53;
              auVar210._0_4_ = uVar53;
              auVar210._8_4_ = uVar53;
              auVar210._12_4_ = uVar53;
              auVar191 = vfmadd231ps_fma(auVar210,auVar101,auVar125);
              uVar53 = *(undefined4 *)(uVar55 + 0x1c0 + lVar61);
              auVar126._4_4_ = uVar53;
              auVar126._0_4_ = uVar53;
              auVar126._8_4_ = uVar53;
              auVar126._12_4_ = uVar53;
              uVar53 = *(undefined4 *)(uVar55 + 0x100 + lVar61);
              auVar219._4_4_ = uVar53;
              auVar219._0_4_ = uVar53;
              auVar219._8_4_ = uVar53;
              auVar219._12_4_ = uVar53;
              auVar192 = vfmadd231ps_fma(auVar219,auVar101,auVar126);
              auVar16._8_8_ = tray.org.field_0._8_8_;
              auVar16._0_8_ = tray.org.field_0._0_8_;
              auVar17._8_8_ = tray.org.field_0._24_8_;
              auVar17._0_8_ = tray.org.field_0._16_8_;
              auVar18._8_8_ = tray.org.field_0._40_8_;
              auVar18._0_8_ = tray.org.field_0._32_8_;
              auVar146 = vsubps_avx(auVar146,auVar16);
              auVar151._0_4_ = tray.rdir.field_0._0_4_ * auVar146._0_4_;
              auVar151._4_4_ = tray.rdir.field_0._4_4_ * auVar146._4_4_;
              auVar151._8_4_ = tray.rdir.field_0._8_4_ * auVar146._8_4_;
              auVar151._12_4_ = tray.rdir.field_0._12_4_ * auVar146._12_4_;
              auVar146 = vsubps_avx(auVar82,auVar17);
              auVar172._0_4_ = tray.rdir.field_0._16_4_ * auVar146._0_4_;
              auVar172._4_4_ = tray.rdir.field_0._20_4_ * auVar146._4_4_;
              auVar172._8_4_ = tray.rdir.field_0._24_4_ * auVar146._8_4_;
              auVar172._12_4_ = tray.rdir.field_0._28_4_ * auVar146._12_4_;
              auVar146 = vsubps_avx(auVar157,auVar18);
              auVar194._0_4_ = tray.rdir.field_0._32_4_ * auVar146._0_4_;
              auVar194._4_4_ = tray.rdir.field_0._36_4_ * auVar146._4_4_;
              auVar194._8_4_ = tray.rdir.field_0._40_4_ * auVar146._8_4_;
              auVar194._12_4_ = tray.rdir.field_0._44_4_ * auVar146._12_4_;
              auVar146 = vsubps_avx(auVar190,auVar16);
              auVar202._0_4_ = tray.rdir.field_0._0_4_ * auVar146._0_4_;
              auVar202._4_4_ = tray.rdir.field_0._4_4_ * auVar146._4_4_;
              auVar202._8_4_ = tray.rdir.field_0._8_4_ * auVar146._8_4_;
              auVar202._12_4_ = tray.rdir.field_0._12_4_ * auVar146._12_4_;
              auVar146 = vsubps_avx(auVar191,auVar17);
              auVar211._0_4_ = tray.rdir.field_0._16_4_ * auVar146._0_4_;
              auVar211._4_4_ = tray.rdir.field_0._20_4_ * auVar146._4_4_;
              auVar211._8_4_ = tray.rdir.field_0._24_4_ * auVar146._8_4_;
              auVar211._12_4_ = tray.rdir.field_0._28_4_ * auVar146._12_4_;
              auVar146 = vsubps_avx(auVar192,auVar18);
              auVar220._0_4_ = tray.rdir.field_0._32_4_ * auVar146._0_4_;
              auVar220._4_4_ = tray.rdir.field_0._36_4_ * auVar146._4_4_;
              auVar220._8_4_ = tray.rdir.field_0._40_4_ * auVar146._8_4_;
              auVar220._12_4_ = tray.rdir.field_0._44_4_ * auVar146._12_4_;
              auVar146 = vpminsd_avx(auVar151,auVar202);
              auVar82 = vpminsd_avx(auVar172,auVar211);
              auVar146 = vpmaxsd_avx(auVar146,auVar82);
              auVar82 = vpminsd_avx(auVar194,auVar220);
              auVar146 = vpmaxsd_avx(auVar146,auVar82);
              auVar127._0_4_ = auVar146._0_4_ * 0.99999964;
              auVar127._4_4_ = auVar146._4_4_ * 0.99999964;
              auVar127._8_4_ = auVar146._8_4_ * 0.99999964;
              auVar127._12_4_ = auVar146._12_4_ * 0.99999964;
              auVar146 = vpmaxsd_avx(auVar151,auVar202);
              auVar82 = vpmaxsd_avx(auVar172,auVar211);
              auVar82 = vpminsd_avx(auVar146,auVar82);
              auVar146 = vpmaxsd_avx(auVar194,auVar220);
              auVar82 = vpminsd_avx(auVar82,auVar146);
              auVar146 = vpmaxsd_avx(auVar127,(undefined1  [16])tray.tnear.field_0);
              auVar173._0_4_ = auVar82._0_4_ * 1.0000004;
              auVar173._4_4_ = auVar82._4_4_ * 1.0000004;
              auVar173._8_4_ = auVar82._8_4_ * 1.0000004;
              auVar173._12_4_ = auVar82._12_4_ * 1.0000004;
              auVar82 = vpminsd_avx(auVar173,(undefined1  [16])tray.tfar.field_0);
              if ((uVar52 & 7) == 6) {
                auVar146 = vcmpps_avx(auVar146,auVar82,2);
                uVar53 = *(undefined4 *)(uVar55 + 0x1e0 + lVar61);
                auVar174._4_4_ = uVar53;
                auVar174._0_4_ = uVar53;
                auVar174._8_4_ = uVar53;
                auVar174._12_4_ = uVar53;
                auVar82 = vcmpps_avx(auVar174,auVar101,2);
                uVar53 = *(undefined4 *)(uVar55 + 0x200 + lVar61);
                auVar195._4_4_ = uVar53;
                auVar195._0_4_ = uVar53;
                auVar195._8_4_ = uVar53;
                auVar195._12_4_ = uVar53;
                auVar101 = vcmpps_avx(auVar101,auVar195,1);
                auVar101 = vandps_avx(auVar82,auVar101);
                auVar101 = vandps_avx(auVar101,auVar146);
              }
              else {
                auVar101 = vcmpps_avx(auVar146,auVar82,2);
              }
              auVar101 = vandps_avx(auVar101,auVar163);
              auVar101 = vpslld_avx(auVar101,0x1f);
              if ((((auVar101 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar101 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar101 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar101[0xf]) {
                auVar114 = ZEXT1664((undefined1  [16])aVar102);
                sVar63 = root.ptr;
              }
              else {
                auVar101 = vblendvps_avx((undefined1  [16])auVar252._0_16_,auVar127,auVar101);
                auVar114 = ZEXT1664(auVar101);
                if (root.ptr != 8) {
                  pNVar66->ptr = root.ptr;
                  pNVar66 = pNVar66 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar67->v = aVar102;
                  paVar67 = paVar67 + 1;
                }
              }
              aVar102 = auVar114._0_16_;
              root.ptr = sVar63;
            }
            if (root.ptr == 8) goto LAB_01642af2;
            auVar163 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar102,6);
            uVar53 = vmovmskps_avx(auVar163);
          } while ((byte)uVar60 < (byte)POPCOUNT(uVar53));
          pNVar66->ptr = root.ptr;
          pNVar66 = pNVar66 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar67->v = aVar102;
          paVar67 = paVar67 + 1;
LAB_01642af2:
          iVar54 = 4;
        }
        else {
          while (uVar55 != 0) {
            sVar63 = 0;
            for (uVar57 = uVar55; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
              sVar63 = sVar63 + 1;
            }
            uVar55 = uVar55 - 1 & uVar55;
            auVar114 = ZEXT1664(auVar114._0_16_);
            bVar51 = occluded1(This,bvh,root,sVar63,&pre,ray,&tray,context);
            if (bVar51) {
              terminated.field_0.i[sVar63] = -1;
            }
          }
          auVar163 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar54 = 3;
          auVar252 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar163 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar163 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar163 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar163[0xf] < '\0') {
            auVar114 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar163._8_4_ = 0xff800000;
            auVar163._0_8_ = 0xff800000ff800000;
            auVar163._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar163,
                               (undefined1  [16])terminated.field_0);
            iVar54 = 2;
          }
          if (uVar60 < uVar52) goto LAB_0164288e;
        }
      } while (iVar54 != 3);
LAB_0164427c:
      auVar14 = vandps_avx(auVar14,(undefined1  [16])terminated.field_0);
      auVar113._8_4_ = 0xff800000;
      auVar113._0_8_ = 0xff800000ff800000;
      auVar113._12_4_ = 0xff800000;
      auVar14 = vmaskmovps_avx(auVar14,auVar113);
      local_3880->flags = auVar14._0_4_;
      local_3880->feature_mask = auVar14._4_4_;
      local_3880->context = (RTCRayQueryContext *)auVar14._8_8_;
    }
  }
  return;
LAB_01642b55:
  do {
    auVar163 = auVar114._0_16_;
    if (pRVar59 == pRVar56) break;
    lVar61 = (long)pRVar59 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    uVar53 = vmovmskps_avx(local_37a8);
    pRVar15 = (RTCIntersectArguments *)0x0;
    uVar57 = CONCAT44((int)((ulong)pRVar58 >> 0x20),uVar53);
    for (uVar55 = uVar57; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      pRVar15 = (RTCIntersectArguments *)((long)&pRVar15->flags + 1);
    }
    auVar114 = ZEXT1664(local_37a8);
    lVar65 = 0;
    pRVar58 = pRVar15;
    local_3878 = pRVar59;
    do {
      auVar101 = auVar114._0_16_;
      if (lVar65 == 4) break;
      iVar54 = *(int *)(lVar61 + 0x50 + lVar65 * 4);
      pRVar58 = (RTCIntersectArguments *)0x0;
      if (iVar54 == -1) break;
      uVar52 = *(uint *)(lVar61 + 0x40 + lVar65 * 4);
      pGVar10 = (context->scene->geometries).items[uVar52].ptr;
      fVar68 = (pGVar10->time_range).lower;
      auVar82._4_4_ = fVar68;
      auVar82._0_4_ = fVar68;
      auVar82._8_4_ = fVar68;
      auVar82._12_4_ = fVar68;
      fVar96 = pGVar10->fnumTimeSegments;
      auVar163 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar82);
      fVar68 = (pGVar10->time_range).upper - fVar68;
      auVar69._4_4_ = fVar68;
      auVar69._0_4_ = fVar68;
      auVar69._8_4_ = fVar68;
      auVar69._12_4_ = fVar68;
      auVar163 = vdivps_avx(auVar163,auVar69);
      auVar70._0_4_ = fVar96 * auVar163._0_4_;
      auVar70._4_4_ = fVar96 * auVar163._4_4_;
      auVar70._8_4_ = fVar96 * auVar163._8_4_;
      auVar70._12_4_ = fVar96 * auVar163._12_4_;
      auVar163 = vroundps_avx(auVar70,1);
      fVar96 = fVar96 + -1.0;
      auVar128._4_4_ = fVar96;
      auVar128._0_4_ = fVar96;
      auVar128._8_4_ = fVar96;
      auVar128._12_4_ = fVar96;
      auVar163 = vminps_avx(auVar163,auVar128);
      auVar163 = vmaxps_avx(auVar163,_DAT_01f45a50);
      auVar146 = vsubps_avx(auVar70,auVar163);
      itime.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar163);
      iVar6 = itime.field_0.i[(long)pRVar15];
      auVar129._4_4_ = iVar6;
      auVar129._0_4_ = iVar6;
      auVar129._8_4_ = iVar6;
      auVar129._12_4_ = iVar6;
      auVar163 = vpcmpeqd_avx(auVar129,(undefined1  [16])itime.field_0);
      auVar163 = local_37a8 & ~auVar163;
      fVar96 = auVar146._4_4_;
      fVar97 = auVar146._8_4_;
      fVar98 = auVar146._12_4_;
      fVar68 = auVar146._0_4_;
      uVar55 = uVar57;
      pRVar58 = pRVar15;
      local_386c = iVar54;
      if ((((auVar163 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar163 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar163 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar163[0xf]
         ) {
        pRVar58 = *(RTCIntersectArguments **)
                   (*(long *)&pGVar10[2].numPrimitives + (long)iVar6 * 0x38);
        lVar62 = *(long *)(*(long *)&pGVar10[2].numPrimitives + 0x38 + (long)iVar6 * 0x38);
        uVar55 = (ulong)*(uint *)(lVar61 + lVar65 * 4);
        uVar64 = (ulong)*(uint *)(lVar61 + 0x10 + lVar65 * 4);
        RVar1 = (&pRVar58->flags)[uVar55];
        auVar196._4_4_ = RVar1;
        auVar196._0_4_ = RVar1;
        auVar196._8_4_ = RVar1;
        auVar196._12_4_ = RVar1;
        RVar2 = (&pRVar58->feature_mask)[uVar55];
        auVar203._4_4_ = RVar2;
        auVar203._0_4_ = RVar2;
        auVar203._8_4_ = RVar2;
        auVar203._12_4_ = RVar2;
        uVar53 = *(undefined4 *)((long)&pRVar58->context + uVar55 * 4);
        auVar212._4_4_ = uVar53;
        auVar212._0_4_ = uVar53;
        auVar212._8_4_ = uVar53;
        auVar212._12_4_ = uVar53;
        fVar99 = *(float *)(lVar62 + uVar55 * 4);
        fVar115 = *(float *)(lVar62 + 4 + uVar55 * 4);
        fVar117 = *(float *)(lVar62 + 8 + uVar55 * 4);
        auVar130._8_4_ = 0x3f800000;
        auVar130._0_8_ = 0x3f8000003f800000;
        auVar130._12_4_ = 0x3f800000;
        auVar163 = vsubps_avx(auVar130,auVar146);
        auVar241._0_4_ = fVar68 * fVar99;
        auVar241._4_4_ = fVar96 * fVar99;
        auVar241._8_4_ = fVar97 * fVar99;
        auVar241._12_4_ = fVar98 * fVar99;
        auVar103._0_4_ = fVar68 * fVar115;
        auVar103._4_4_ = fVar96 * fVar115;
        auVar103._8_4_ = fVar97 * fVar115;
        auVar103._12_4_ = fVar98 * fVar115;
        auVar175._0_4_ = fVar117 * fVar68;
        auVar175._4_4_ = fVar117 * fVar96;
        auVar175._8_4_ = fVar117 * fVar97;
        auVar175._12_4_ = fVar117 * fVar98;
        auVar244 = vfmadd231ps_fma(auVar241,auVar163,auVar196);
        _local_3858 = vfmadd231ps_fma(auVar103,auVar163,auVar203);
        auVar183 = vfmadd231ps_fma(auVar175,auVar163,auVar212);
        RVar1 = (&pRVar58->flags)[uVar64];
        auVar197._4_4_ = RVar1;
        auVar197._0_4_ = RVar1;
        auVar197._8_4_ = RVar1;
        auVar197._12_4_ = RVar1;
        RVar2 = (&pRVar58->feature_mask)[uVar64];
        auVar204._4_4_ = RVar2;
        auVar204._0_4_ = RVar2;
        auVar204._8_4_ = RVar2;
        auVar204._12_4_ = RVar2;
        uVar53 = *(undefined4 *)((long)&pRVar58->context + uVar64 * 4);
        auVar213._4_4_ = uVar53;
        auVar213._0_4_ = uVar53;
        auVar213._8_4_ = uVar53;
        auVar213._12_4_ = uVar53;
        fVar99 = *(float *)(lVar62 + uVar64 * 4);
        fVar115 = *(float *)(lVar62 + 4 + uVar64 * 4);
        fVar117 = *(float *)(lVar62 + 8 + uVar64 * 4);
        auVar131._0_4_ = fVar99 * fVar68;
        auVar131._4_4_ = fVar99 * fVar96;
        auVar131._8_4_ = fVar99 * fVar97;
        auVar131._12_4_ = fVar99 * fVar98;
        auVar228._0_4_ = fVar115 * fVar68;
        auVar228._4_4_ = fVar115 * fVar96;
        auVar228._8_4_ = fVar115 * fVar97;
        auVar228._12_4_ = fVar115 * fVar98;
        auVar221._0_4_ = fVar117 * fVar68;
        auVar221._4_4_ = fVar117 * fVar96;
        auVar221._8_4_ = fVar117 * fVar97;
        auVar221._12_4_ = fVar117 * fVar98;
        _local_38a8 = vfmadd231ps_fma(auVar131,auVar163,auVar197);
        _local_38c8 = vfmadd231ps_fma(auVar228,auVar163,auVar204);
        _local_3938 = vfmadd231ps_fma(auVar221,auVar163,auVar213);
        uVar55 = (ulong)*(uint *)(lVar61 + 0x20 + lVar65 * 4);
        RVar1 = (&pRVar58->flags)[uVar55];
        auVar198._4_4_ = RVar1;
        auVar198._0_4_ = RVar1;
        auVar198._8_4_ = RVar1;
        auVar198._12_4_ = RVar1;
        RVar2 = (&pRVar58->feature_mask)[uVar55];
        auVar205._4_4_ = RVar2;
        auVar205._0_4_ = RVar2;
        auVar205._8_4_ = RVar2;
        auVar205._12_4_ = RVar2;
        uVar53 = *(undefined4 *)((long)&pRVar58->context + uVar55 * 4);
        auVar214._4_4_ = uVar53;
        auVar214._0_4_ = uVar53;
        auVar214._8_4_ = uVar53;
        auVar214._12_4_ = uVar53;
        fVar99 = *(float *)(lVar62 + uVar55 * 4);
        fVar115 = *(float *)(lVar62 + 4 + uVar55 * 4);
        fVar117 = *(float *)(lVar62 + 8 + uVar55 * 4);
        auVar246._0_4_ = fVar99 * fVar68;
        auVar246._4_4_ = fVar99 * fVar96;
        auVar246._8_4_ = fVar99 * fVar97;
        auVar246._12_4_ = fVar99 * fVar98;
        auVar222._0_4_ = fVar115 * fVar68;
        auVar222._4_4_ = fVar115 * fVar96;
        auVar222._8_4_ = fVar115 * fVar97;
        auVar222._12_4_ = fVar115 * fVar98;
        auVar229._0_4_ = fVar117 * fVar68;
        auVar229._4_4_ = fVar117 * fVar96;
        auVar229._8_4_ = fVar117 * fVar97;
        auVar229._12_4_ = fVar117 * fVar98;
        _local_3778 = vfmadd231ps_fma(auVar246,auVar163,auVar198);
        _local_3758 = vfmadd231ps_fma(auVar222,auVar163,auVar205);
        _local_3768 = vfmadd231ps_fma(auVar229,auVar163,auVar214);
        uVar55 = (ulong)*(uint *)(lVar61 + 0x30 + lVar65 * 4);
        fVar99 = *(float *)(lVar62 + uVar55 * 4);
        fVar115 = *(float *)(lVar62 + 4 + uVar55 * 4);
        fVar117 = *(float *)(lVar62 + 8 + uVar55 * 4);
        auVar199._0_4_ = fVar68 * fVar99;
        auVar199._4_4_ = fVar96 * fVar99;
        auVar199._8_4_ = fVar97 * fVar99;
        auVar199._12_4_ = fVar98 * fVar99;
        auVar230._0_4_ = fVar68 * fVar115;
        auVar230._4_4_ = fVar96 * fVar115;
        auVar230._8_4_ = fVar97 * fVar115;
        auVar230._12_4_ = fVar98 * fVar115;
        auVar253._0_4_ = fVar68 * fVar117;
        auVar253._4_4_ = fVar96 * fVar117;
        auVar253._8_4_ = fVar97 * fVar117;
        auVar253._12_4_ = fVar98 * fVar117;
        RVar1 = (&pRVar58->flags)[uVar55];
        auVar71._4_4_ = RVar1;
        auVar71._0_4_ = RVar1;
        auVar71._8_4_ = RVar1;
        auVar71._12_4_ = RVar1;
        auVar112 = vfmadd231ps_fma(auVar199,auVar163,auVar71);
        RVar2 = (&pRVar58->feature_mask)[uVar55];
        auVar72._4_4_ = RVar2;
        auVar72._0_4_ = RVar2;
        auVar72._8_4_ = RVar2;
        auVar72._12_4_ = RVar2;
        auVar233 = vfmadd231ps_fma(auVar230,auVar163,auVar72);
        uVar53 = *(undefined4 *)((long)&pRVar58->context + uVar55 * 4);
        auVar73._4_4_ = uVar53;
        auVar73._0_4_ = uVar53;
        auVar73._8_4_ = uVar53;
        auVar73._12_4_ = uVar53;
        auVar255 = vfmadd231ps_fma(auVar253,auVar163,auVar73);
      }
      else {
        while (uVar55 != 0) {
          lVar62 = (long)itime.field_0.i[(long)pRVar58] * 0x38;
          uVar64 = (ulong)*(uint *)(lVar61 + lVar65 * 4);
          auVar163 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar10[2].numPrimitives + lVar62) + uVar64 * 4);
          auVar82 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar10[2].numPrimitives + 0x38 + lVar62) + uVar64 * 4);
          *(int *)((long)&p0.field_0 + (long)pRVar58 * 4) = auVar163._0_4_;
          uVar53 = vextractps_avx(auVar163,1);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar58 * 4 + 0x10) = uVar53;
          uVar53 = vextractps_avx(auVar163,2);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar58 * 4 + 0x20) = uVar53;
          *(int *)((long)&p1.field_0 + (long)pRVar58 * 4) = auVar82._0_4_;
          uVar53 = vextractps_avx(auVar82,1);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar58 * 4 + 0x10) = uVar53;
          uVar53 = vextractps_avx(auVar82,2);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar58 * 4 + 0x20) = uVar53;
          uVar64 = (ulong)pRVar58 & 0x3f;
          pRVar58 = (RTCIntersectArguments *)0x0;
          uVar55 = uVar55 ^ 1L << uVar64;
          for (uVar64 = uVar55; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            pRVar58 = (RTCIntersectArguments *)((long)&pRVar58->flags + 1);
          }
        }
        auVar111._8_4_ = 0x3f800000;
        auVar111._0_8_ = 0x3f8000003f800000;
        auVar111._12_4_ = 0x3f800000;
        auVar163 = vsubps_avx(auVar111,auVar146);
        uVar32 = p0.field_0._0_4_;
        uVar34 = p0.field_0._4_4_;
        uVar36 = p0.field_0._8_4_;
        uVar38 = p0.field_0._12_4_;
        uVar40 = p0.field_0._32_4_;
        uVar42 = p0.field_0._36_4_;
        uVar45 = p0.field_0._40_4_;
        uVar48 = p0.field_0._44_4_;
        fVar149 = auVar163._0_4_;
        fVar99 = fVar149 * (float)p0.field_0._16_4_;
        fVar166 = auVar163._4_4_;
        fVar115 = fVar166 * (float)p0.field_0._20_4_;
        fVar167 = auVar163._8_4_;
        fVar117 = fVar167 * (float)p0.field_0._24_4_;
        fVar168 = auVar163._12_4_;
        fVar119 = fVar168 * (float)p0.field_0._28_4_;
        uVar53 = p1.field_0._0_4_;
        uVar26 = p1.field_0._4_4_;
        uVar28 = p1.field_0._8_4_;
        uVar30 = p1.field_0._12_4_;
        fVar169 = fVar68 * (float)p1.field_0._16_4_;
        fVar184 = fVar96 * (float)p1.field_0._20_4_;
        fVar186 = fVar97 * (float)p1.field_0._24_4_;
        fVar188 = fVar98 * (float)p1.field_0._28_4_;
        fVar170 = fVar68 * (float)p1.field_0._32_4_;
        fVar185 = fVar96 * (float)p1.field_0._36_4_;
        fVar187 = fVar97 * (float)p1.field_0._40_4_;
        fVar189 = fVar98 * (float)p1.field_0._44_4_;
        uVar55 = uVar57;
        pRVar58 = pRVar15;
        while (uVar55 != 0) {
          lVar62 = (long)itime.field_0.i[(long)pRVar58] * 0x38;
          uVar64 = (ulong)*(uint *)(lVar61 + 0x10 + lVar65 * 4);
          auVar163 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar10[2].numPrimitives + lVar62) + uVar64 * 4);
          auVar146 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar10[2].numPrimitives + 0x38 + lVar62) + uVar64 * 4);
          *(int *)((long)&p0.field_0 + (long)pRVar58 * 4) = auVar163._0_4_;
          uVar7 = vextractps_avx(auVar163,1);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar58 * 4 + 0x10) = uVar7;
          uVar7 = vextractps_avx(auVar163,2);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar58 * 4 + 0x20) = uVar7;
          *(int *)((long)&p1.field_0 + (long)pRVar58 * 4) = auVar146._0_4_;
          uVar7 = vextractps_avx(auVar146,1);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar58 * 4 + 0x10) = uVar7;
          uVar7 = vextractps_avx(auVar146,2);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar58 * 4 + 0x20) = uVar7;
          uVar64 = (ulong)pRVar58 & 0x3f;
          pRVar58 = (RTCIntersectArguments *)0x0;
          uVar55 = uVar55 ^ 1L << uVar64;
          for (uVar64 = uVar55; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            pRVar58 = (RTCIntersectArguments *)((long)&pRVar58->flags + 1);
          }
        }
        local_3858._4_4_ = fVar115 + fVar184;
        local_3858._0_4_ = fVar99 + fVar169;
        fStack_3850 = fVar117 + fVar186;
        fStack_384c = fVar119 + fVar188;
        auVar244._0_4_ = fVar149 * (float)uVar32 + fVar68 * (float)uVar53;
        auVar244._4_4_ = fVar166 * (float)uVar34 + fVar96 * (float)uVar26;
        auVar244._8_4_ = fVar167 * (float)uVar36 + fVar97 * (float)uVar28;
        auVar244._12_4_ = fVar168 * (float)uVar38 + fVar98 * (float)uVar30;
        uVar32 = p0.field_0._0_4_;
        uVar34 = p0.field_0._4_4_;
        uVar36 = p0.field_0._8_4_;
        uVar38 = p0.field_0._12_4_;
        uVar7 = p0.field_0._32_4_;
        uVar43 = p0.field_0._36_4_;
        uVar46 = p0.field_0._40_4_;
        uVar49 = p0.field_0._44_4_;
        fVar99 = fVar149 * (float)p0.field_0._16_4_;
        fVar117 = fVar166 * (float)p0.field_0._20_4_;
        fVar169 = fVar167 * (float)p0.field_0._24_4_;
        fVar186 = fVar168 * (float)p0.field_0._28_4_;
        uVar53 = p1.field_0._0_4_;
        uVar26 = p1.field_0._4_4_;
        uVar28 = p1.field_0._8_4_;
        uVar30 = p1.field_0._12_4_;
        fVar234 = fVar68 * (float)p1.field_0._16_4_;
        fVar237 = fVar96 * (float)p1.field_0._20_4_;
        fVar238 = fVar97 * (float)p1.field_0._24_4_;
        fVar239 = fVar98 * (float)p1.field_0._28_4_;
        fVar115 = fVar68 * (float)p1.field_0._32_4_;
        fVar119 = fVar96 * (float)p1.field_0._36_4_;
        fVar184 = fVar97 * (float)p1.field_0._40_4_;
        fVar188 = fVar98 * (float)p1.field_0._44_4_;
        uVar55 = uVar57;
        pRVar58 = pRVar15;
        while (uVar55 != 0) {
          lVar62 = (long)itime.field_0.i[(long)pRVar58] * 0x38;
          uVar64 = (ulong)*(uint *)(lVar61 + 0x20 + lVar65 * 4);
          auVar163 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar10[2].numPrimitives + lVar62) + uVar64 * 4);
          auVar146 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar10[2].numPrimitives + 0x38 + lVar62) + uVar64 * 4);
          *(int *)((long)&p0.field_0 + (long)pRVar58 * 4) = auVar163._0_4_;
          uVar8 = vextractps_avx(auVar163,1);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar58 * 4 + 0x10) = uVar8;
          uVar8 = vextractps_avx(auVar163,2);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar58 * 4 + 0x20) = uVar8;
          *(int *)((long)&p1.field_0 + (long)pRVar58 * 4) = auVar146._0_4_;
          uVar8 = vextractps_avx(auVar146,1);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar58 * 4 + 0x10) = uVar8;
          uVar8 = vextractps_avx(auVar146,2);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar58 * 4 + 0x20) = uVar8;
          uVar64 = (ulong)pRVar58 & 0x3f;
          pRVar58 = (RTCIntersectArguments *)0x0;
          uVar55 = uVar55 ^ 1L << uVar64;
          for (uVar64 = uVar55; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            pRVar58 = (RTCIntersectArguments *)((long)&pRVar58->flags + 1);
          }
        }
        uVar33 = p0.field_0._0_4_;
        uVar35 = p0.field_0._4_4_;
        uVar37 = p0.field_0._8_4_;
        uVar39 = p0.field_0._12_4_;
        uVar41 = p0.field_0._32_4_;
        uVar44 = p0.field_0._36_4_;
        uVar47 = p0.field_0._40_4_;
        uVar50 = p0.field_0._44_4_;
        uVar8 = p1.field_0._0_4_;
        uVar27 = p1.field_0._4_4_;
        uVar29 = p1.field_0._8_4_;
        uVar31 = p1.field_0._12_4_;
        local_3758._4_4_ = fVar96 * (float)p1.field_0._20_4_ + fVar166 * (float)p0.field_0._20_4_;
        local_3758._0_4_ = fVar68 * (float)p1.field_0._16_4_ + fVar149 * (float)p0.field_0._16_4_;
        fStack_3750 = fVar97 * (float)p1.field_0._24_4_ + fVar167 * (float)p0.field_0._24_4_;
        fStack_374c = fVar98 * (float)p1.field_0._28_4_ + fVar168 * (float)p0.field_0._28_4_;
        fVar100 = fVar68 * (float)p1.field_0._32_4_;
        fVar116 = fVar96 * (float)p1.field_0._36_4_;
        fVar118 = fVar97 * (float)p1.field_0._40_4_;
        fVar120 = fVar98 * (float)p1.field_0._44_4_;
        uVar55 = uVar57;
        pRVar58 = pRVar15;
        while (uVar55 != 0) {
          lVar62 = (long)itime.field_0.i[(long)pRVar58] * 0x38;
          uVar64 = (ulong)*(uint *)(lVar61 + 0x30 + lVar65 * 4);
          auVar163 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar10[2].numPrimitives + lVar62) + uVar64 * 4);
          auVar146 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar10[2].numPrimitives + 0x38 + lVar62) + uVar64 * 4);
          *(int *)((long)&p0.field_0 + (long)pRVar58 * 4) = auVar163._0_4_;
          uVar9 = vextractps_avx(auVar163,1);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar58 * 4 + 0x10) = uVar9;
          uVar9 = vextractps_avx(auVar163,2);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar58 * 4 + 0x20) = uVar9;
          *(int *)((long)&p1.field_0 + (long)pRVar58 * 4) = auVar146._0_4_;
          uVar9 = vextractps_avx(auVar146,1);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar58 * 4 + 0x10) = uVar9;
          uVar9 = vextractps_avx(auVar146,2);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar58 * 4 + 0x20) = uVar9;
          uVar64 = (ulong)pRVar58 & 0x3f;
          pRVar58 = (RTCIntersectArguments *)0x0;
          uVar55 = uVar55 ^ 1L << uVar64;
          for (uVar64 = uVar55; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            pRVar58 = (RTCIntersectArguments *)((long)&pRVar58->flags + 1);
          }
        }
        auVar183._0_4_ = fVar149 * (float)uVar40 + fVar170;
        auVar183._4_4_ = fVar166 * (float)uVar42 + fVar185;
        auVar183._8_4_ = fVar167 * (float)uVar45 + fVar187;
        auVar183._12_4_ = fVar168 * (float)uVar48 + fVar189;
        local_3938._4_4_ = fVar166 * (float)uVar43 + fVar119;
        local_3938._0_4_ = fVar149 * (float)uVar7 + fVar115;
        fStack_3930 = fVar167 * (float)uVar46 + fVar184;
        fStack_392c = fVar168 * (float)uVar49 + fVar188;
        local_3768._4_4_ = (float)uVar44 * fVar166 + fVar116;
        local_3768._0_4_ = (float)uVar41 * fVar149 + fVar100;
        fStack_3760 = (float)uVar47 * fVar167 + fVar118;
        fStack_375c = (float)uVar50 * fVar168 + fVar120;
        local_3778._4_4_ = (float)uVar35 * fVar166 + (float)uVar27 * fVar96;
        local_3778._0_4_ = (float)uVar33 * fVar149 + (float)uVar8 * fVar68;
        fStack_3770 = (float)uVar37 * fVar167 + (float)uVar29 * fVar97;
        fStack_376c = (float)uVar39 * fVar168 + (float)uVar31 * fVar98;
        auVar112._0_4_ = fVar68 * (float)p1.field_0._0_4_ + fVar149 * (float)p0.field_0._0_4_;
        auVar112._4_4_ = fVar96 * (float)p1.field_0._4_4_ + fVar166 * (float)p0.field_0._4_4_;
        auVar112._8_4_ = fVar97 * (float)p1.field_0._8_4_ + fVar167 * (float)p0.field_0._8_4_;
        auVar112._12_4_ = fVar98 * (float)p1.field_0._12_4_ + fVar168 * (float)p0.field_0._12_4_;
        auVar233._0_4_ = fVar149 * (float)p0.field_0._16_4_ + fVar68 * (float)p1.field_0._16_4_;
        auVar233._4_4_ = fVar166 * (float)p0.field_0._20_4_ + fVar96 * (float)p1.field_0._20_4_;
        auVar233._8_4_ = fVar167 * (float)p0.field_0._24_4_ + fVar97 * (float)p1.field_0._24_4_;
        auVar233._12_4_ = fVar168 * (float)p0.field_0._28_4_ + fVar98 * (float)p1.field_0._28_4_;
        auVar255._0_4_ = fVar149 * (float)p0.field_0._32_4_ + fVar68 * (float)p1.field_0._32_4_;
        auVar255._4_4_ = fVar166 * (float)p0.field_0._36_4_ + fVar96 * (float)p1.field_0._36_4_;
        auVar255._8_4_ = fVar167 * (float)p0.field_0._40_4_ + fVar97 * (float)p1.field_0._40_4_;
        auVar255._12_4_ = fVar168 * (float)p0.field_0._44_4_ + fVar98 * (float)p1.field_0._44_4_;
        local_38a8._4_4_ = (float)uVar34 * fVar166 + (float)uVar26 * fVar96;
        local_38a8._0_4_ = (float)uVar32 * fVar149 + (float)uVar53 * fVar68;
        fStack_38a0 = (float)uVar36 * fVar167 + (float)uVar28 * fVar97;
        fStack_389c = (float)uVar38 * fVar168 + (float)uVar30 * fVar98;
        local_38c8._4_4_ = fVar237 + fVar117;
        local_38c8._0_4_ = fVar234 + fVar99;
        fStack_38c0 = fVar238 + fVar169;
        fStack_38bc = fVar239 + fVar186;
        pRVar58 = (RTCIntersectArguments *)0x0;
      }
      auVar163 = *(undefined1 (*) [16])ray;
      auVar146 = *(undefined1 (*) [16])(ray + 0x10);
      auVar82 = *(undefined1 (*) [16])(ray + 0x20);
      auVar191 = vsubps_avx(auVar244,auVar163);
      auVar192 = vsubps_avx(_local_3858,auVar146);
      local_3868 = vsubps_avx(auVar183,auVar82);
      auVar226 = vsubps_avx(auVar112,auVar163);
      auVar227 = vsubps_avx(auVar233,auVar146);
      auVar245 = vsubps_avx(auVar255,auVar82);
      auVar69 = vsubps_avx(auVar226,auVar191);
      auVar70 = vsubps_avx(auVar227,auVar192);
      auVar128 = vsubps_avx(auVar245,local_3868);
      auVar152._0_4_ = auVar226._0_4_ + auVar191._0_4_;
      auVar152._4_4_ = auVar226._4_4_ + auVar191._4_4_;
      auVar152._8_4_ = auVar226._8_4_ + auVar191._8_4_;
      auVar152._12_4_ = auVar226._12_4_ + auVar191._12_4_;
      auVar176._0_4_ = auVar227._0_4_ + auVar192._0_4_;
      auVar176._4_4_ = auVar227._4_4_ + auVar192._4_4_;
      auVar176._8_4_ = auVar227._8_4_ + auVar192._8_4_;
      auVar176._12_4_ = auVar227._12_4_ + auVar192._12_4_;
      fVar68 = local_3868._0_4_;
      auVar231._0_4_ = auVar245._0_4_ + fVar68;
      fVar96 = local_3868._4_4_;
      auVar231._4_4_ = auVar245._4_4_ + fVar96;
      fVar97 = local_3868._8_4_;
      auVar231._8_4_ = auVar245._8_4_ + fVar97;
      fVar98 = local_3868._12_4_;
      auVar231._12_4_ = auVar245._12_4_ + fVar98;
      auVar254._0_4_ = auVar176._0_4_ * auVar128._0_4_;
      auVar254._4_4_ = auVar176._4_4_ * auVar128._4_4_;
      auVar254._8_4_ = auVar176._8_4_ * auVar128._8_4_;
      auVar254._12_4_ = auVar176._12_4_ * auVar128._12_4_;
      auVar111 = vfmsub231ps_fma(auVar254,auVar70,auVar231);
      auVar242._0_4_ = auVar231._0_4_ * auVar69._0_4_;
      auVar242._4_4_ = auVar231._4_4_ * auVar69._4_4_;
      auVar242._8_4_ = auVar231._8_4_ * auVar69._8_4_;
      auVar242._12_4_ = auVar231._12_4_ * auVar69._12_4_;
      auVar190 = vfmsub231ps_fma(auVar242,auVar128,auVar152);
      auVar74._0_4_ = auVar152._0_4_ * auVar70._0_4_;
      auVar74._4_4_ = auVar152._4_4_ * auVar70._4_4_;
      auVar74._8_4_ = auVar152._8_4_ * auVar70._8_4_;
      auVar74._12_4_ = auVar152._12_4_ * auVar70._12_4_;
      auVar157 = vfmsub231ps_fma(auVar74,auVar69,auVar176);
      fVar169 = *(float *)(ray + 0x60);
      fVar170 = *(float *)(ray + 100);
      fVar184 = *(float *)(ray + 0x68);
      auVar21 = *(undefined1 (*) [12])(ray + 0x60);
      fVar185 = *(float *)(ray + 0x6c);
      auVar232._0_4_ = fVar169 * auVar157._0_4_;
      auVar232._4_4_ = fVar170 * auVar157._4_4_;
      auVar232._8_4_ = fVar184 * auVar157._8_4_;
      auVar232._12_4_ = fVar185 * auVar157._12_4_;
      auVar157 = *(undefined1 (*) [16])(ray + 0x50);
      auVar129 = vfmadd231ps_fma(auVar232,auVar157,auVar190);
      auVar190 = *(undefined1 (*) [16])(ray + 0x40);
      auVar71 = vfmadd231ps_fma(auVar129,auVar190,auVar111);
      auVar163 = vsubps_avx(_local_38a8,auVar163);
      auVar146 = vsubps_avx(_local_38c8,auVar146);
      auVar82 = vsubps_avx(_local_3938,auVar82);
      auVar129 = vsubps_avx(auVar192,auVar146);
      auVar111 = vsubps_avx(local_3868,auVar82);
      auVar177._0_4_ = auVar192._0_4_ + auVar146._0_4_;
      auVar177._4_4_ = auVar192._4_4_ + auVar146._4_4_;
      auVar177._8_4_ = auVar192._8_4_ + auVar146._8_4_;
      auVar177._12_4_ = auVar192._12_4_ + auVar146._12_4_;
      auVar247._0_4_ = fVar68 + auVar82._0_4_;
      auVar247._4_4_ = fVar96 + auVar82._4_4_;
      auVar247._8_4_ = fVar97 + auVar82._8_4_;
      auVar247._12_4_ = fVar98 + auVar82._12_4_;
      fVar186 = auVar111._0_4_;
      auVar104._0_4_ = fVar186 * auVar177._0_4_;
      fVar187 = auVar111._4_4_;
      auVar104._4_4_ = fVar187 * auVar177._4_4_;
      fVar188 = auVar111._8_4_;
      auVar104._8_4_ = fVar188 * auVar177._8_4_;
      fVar189 = auVar111._12_4_;
      auVar104._12_4_ = fVar189 * auVar177._12_4_;
      auVar72 = vfmsub231ps_fma(auVar104,auVar129,auVar247);
      auVar244 = vsubps_avx(auVar191,auVar163);
      fVar99 = auVar244._0_4_;
      auVar248._0_4_ = auVar247._0_4_ * fVar99;
      fVar117 = auVar244._4_4_;
      auVar248._4_4_ = auVar247._4_4_ * fVar117;
      fVar149 = auVar244._8_4_;
      auVar248._8_4_ = auVar247._8_4_ * fVar149;
      fVar167 = auVar244._12_4_;
      auVar248._12_4_ = auVar247._12_4_ * fVar167;
      auVar206._0_4_ = auVar191._0_4_ + auVar163._0_4_;
      auVar206._4_4_ = auVar191._4_4_ + auVar163._4_4_;
      auVar206._8_4_ = auVar191._8_4_ + auVar163._8_4_;
      auVar206._12_4_ = auVar191._12_4_ + auVar163._12_4_;
      auVar183 = vfmsub231ps_fma(auVar248,auVar111,auVar206);
      fVar115 = auVar129._0_4_;
      auVar207._0_4_ = auVar206._0_4_ * fVar115;
      fVar119 = auVar129._4_4_;
      auVar207._4_4_ = auVar206._4_4_ * fVar119;
      fVar166 = auVar129._8_4_;
      auVar207._8_4_ = auVar206._8_4_ * fVar166;
      fVar168 = auVar129._12_4_;
      auVar207._12_4_ = auVar206._12_4_ * fVar168;
      auVar73 = vfmsub231ps_fma(auVar207,auVar244,auVar177);
      auVar243._0_4_ = fVar169 * auVar73._0_4_;
      auVar243._4_4_ = fVar170 * auVar73._4_4_;
      auVar243._8_4_ = fVar184 * auVar73._8_4_;
      auVar243._12_4_ = fVar185 * auVar73._12_4_;
      auVar183 = vfmadd231ps_fma(auVar243,auVar157,auVar183);
      auVar72 = vfmadd231ps_fma(auVar183,auVar190,auVar72);
      auVar183 = vsubps_avx(auVar163,auVar226);
      auVar75._0_4_ = auVar226._0_4_ + auVar163._0_4_;
      auVar75._4_4_ = auVar226._4_4_ + auVar163._4_4_;
      auVar75._8_4_ = auVar226._8_4_ + auVar163._8_4_;
      auVar75._12_4_ = auVar226._12_4_ + auVar163._12_4_;
      auVar226 = vsubps_avx(auVar146,auVar227);
      auVar105._0_4_ = auVar227._0_4_ + auVar146._0_4_;
      auVar105._4_4_ = auVar227._4_4_ + auVar146._4_4_;
      auVar105._8_4_ = auVar227._8_4_ + auVar146._8_4_;
      auVar105._12_4_ = auVar227._12_4_ + auVar146._12_4_;
      auVar227 = vsubps_avx(auVar82,auVar245);
      auVar132._0_4_ = auVar82._0_4_ + auVar245._0_4_;
      auVar132._4_4_ = auVar82._4_4_ + auVar245._4_4_;
      auVar132._8_4_ = auVar82._8_4_ + auVar245._8_4_;
      auVar132._12_4_ = auVar82._12_4_ + auVar245._12_4_;
      auVar153._0_4_ = auVar227._0_4_ * auVar105._0_4_;
      auVar153._4_4_ = auVar227._4_4_ * auVar105._4_4_;
      auVar153._8_4_ = auVar227._8_4_ * auVar105._8_4_;
      auVar153._12_4_ = auVar227._12_4_ * auVar105._12_4_;
      auVar146 = vfmsub231ps_fma(auVar153,auVar226,auVar132);
      auVar133._0_4_ = auVar183._0_4_ * auVar132._0_4_;
      auVar133._4_4_ = auVar183._4_4_ * auVar132._4_4_;
      auVar133._8_4_ = auVar183._8_4_ * auVar132._8_4_;
      auVar133._12_4_ = auVar183._12_4_ * auVar132._12_4_;
      auVar163 = vfmsub231ps_fma(auVar133,auVar227,auVar75);
      auVar76._0_4_ = auVar75._0_4_ * auVar226._0_4_;
      auVar76._4_4_ = auVar75._4_4_ * auVar226._4_4_;
      auVar76._8_4_ = auVar75._8_4_ * auVar226._8_4_;
      auVar76._12_4_ = auVar75._12_4_ * auVar226._12_4_;
      auVar82 = vfmsub231ps_fma(auVar76,auVar183,auVar105);
      auVar77._0_4_ = fVar169 * auVar82._0_4_;
      auVar77._4_4_ = fVar170 * auVar82._4_4_;
      auVar77._8_4_ = fVar184 * auVar82._8_4_;
      auVar77._12_4_ = fVar185 * auVar82._12_4_;
      auVar163 = vfmadd231ps_fma(auVar77,auVar157,auVar163);
      auVar245 = vfmadd231ps_fma(auVar163,auVar190,auVar146);
      auVar208._0_4_ = auVar245._0_4_ + auVar71._0_4_ + auVar72._0_4_;
      auVar208._4_4_ = auVar245._4_4_ + auVar71._4_4_ + auVar72._4_4_;
      auVar208._8_4_ = auVar245._8_4_ + auVar71._8_4_ + auVar72._8_4_;
      auVar208._12_4_ = auVar245._12_4_ + auVar71._12_4_ + auVar72._12_4_;
      auVar163 = vminps_avx(auVar71,auVar72);
      auVar146 = vminps_avx(auVar163,auVar245);
      auVar163 = vandps_avx(auVar240,auVar208);
      auVar134._0_8_ = CONCAT44(auVar163._4_4_ * 1.1920929e-07,auVar163._0_4_ * 1.1920929e-07);
      auVar134._8_4_ = auVar163._8_4_ * 1.1920929e-07;
      auVar134._12_4_ = auVar163._12_4_ * 1.1920929e-07;
      fStack_3850 = -0.0;
      local_3858 = (undefined1  [8])0x8000000080000000;
      fStack_384c = -0.0;
      auVar154._0_8_ = auVar134._0_8_ ^ 0x8000000080000000;
      auVar154._8_4_ = -auVar134._8_4_;
      auVar154._12_4_ = -auVar134._12_4_;
      auVar146 = vcmpps_avx(auVar146,auVar154,5);
      auVar82 = vmaxps_avx(auVar71,auVar72);
      auVar82 = vmaxps_avx(auVar82,auVar245);
      auVar82 = vcmpps_avx(auVar82,auVar134,2);
      auVar146 = vorps_avx(auVar146,auVar82);
      auVar82 = auVar101 & auVar146;
      if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar82[0xf] < '\0'
         ) {
        auVar78._0_4_ = fVar115 * auVar128._0_4_;
        auVar78._4_4_ = fVar119 * auVar128._4_4_;
        auVar78._8_4_ = fVar166 * auVar128._8_4_;
        auVar78._12_4_ = fVar168 * auVar128._12_4_;
        auVar106._0_4_ = auVar70._0_4_ * fVar99;
        auVar106._4_4_ = auVar70._4_4_ * fVar117;
        auVar106._8_4_ = auVar70._8_4_ * fVar149;
        auVar106._12_4_ = auVar70._12_4_ * fVar167;
        auVar245 = vfmsub213ps_fma(auVar70,auVar111,auVar78);
        auVar135._0_4_ = fVar186 * auVar226._0_4_;
        auVar135._4_4_ = fVar187 * auVar226._4_4_;
        auVar135._8_4_ = fVar188 * auVar226._8_4_;
        auVar135._12_4_ = fVar189 * auVar226._12_4_;
        auVar155._0_4_ = auVar227._0_4_ * fVar99;
        auVar155._4_4_ = auVar227._4_4_ * fVar117;
        auVar155._8_4_ = auVar227._8_4_ * fVar149;
        auVar155._12_4_ = auVar227._12_4_ * fVar167;
        auVar70 = vfmsub213ps_fma(auVar227,auVar129,auVar135);
        auVar82 = vandps_avx(auVar240,auVar78);
        auVar227 = vandps_avx(auVar240,auVar135);
        auVar82 = vcmpps_avx(auVar82,auVar227,1);
        vVar12.field_0 =
             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar70,auVar245,auVar82);
        auVar79._0_4_ = auVar183._0_4_ * fVar115;
        auVar79._4_4_ = auVar183._4_4_ * fVar119;
        auVar79._8_4_ = auVar183._8_4_ * fVar166;
        auVar79._12_4_ = auVar183._12_4_ * fVar168;
        auVar245 = vfmsub213ps_fma(auVar183,auVar111,auVar155);
        auVar136._0_4_ = auVar69._0_4_ * fVar186;
        auVar136._4_4_ = auVar69._4_4_ * fVar187;
        auVar136._8_4_ = auVar69._8_4_ * fVar188;
        auVar136._12_4_ = auVar69._12_4_ * fVar189;
        auVar70 = vfmsub213ps_fma(auVar128,auVar244,auVar136);
        auVar82 = vandps_avx(auVar240,auVar136);
        auVar227 = vandps_avx(auVar240,auVar155);
        auVar82 = vcmpps_avx(auVar82,auVar227,1);
        vVar13.field_0 =
             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar245,auVar70,auVar82);
        auVar227 = vfmsub213ps_fma(auVar69,auVar129,auVar106);
        auVar245 = vfmsub213ps_fma(auVar226,auVar244,auVar79);
        auVar82 = vandps_avx(auVar240,auVar106);
        auVar226 = vandps_avx(auVar240,auVar79);
        auVar82 = vcmpps_avx(auVar82,auVar226,1);
        auVar226 = vblendvps_avx(auVar245,auVar227,auVar82);
        local_3728 = auVar21._0_4_;
        fStack_3724 = auVar21._4_4_;
        fStack_3720 = auVar21._8_4_;
        auVar80._0_4_ = auVar226._0_4_ * local_3728;
        auVar80._4_4_ = auVar226._4_4_ * fStack_3724;
        auVar80._8_4_ = auVar226._8_4_ * fStack_3720;
        auVar80._12_4_ = auVar226._12_4_ * fVar185;
        auVar82 = vfmadd213ps_fma(auVar157,(undefined1  [16])vVar13.field_0,auVar80);
        auVar82 = vfmadd213ps_fma(auVar190,(undefined1  [16])vVar12.field_0,auVar82);
        auVar81._0_4_ = auVar82._0_4_ + auVar82._0_4_;
        auVar81._4_4_ = auVar82._4_4_ + auVar82._4_4_;
        auVar81._8_4_ = auVar82._8_4_ + auVar82._8_4_;
        auVar81._12_4_ = auVar82._12_4_ + auVar82._12_4_;
        auVar107._0_4_ = auVar226._0_4_ * fVar68;
        auVar107._4_4_ = auVar226._4_4_ * fVar96;
        auVar107._8_4_ = auVar226._8_4_ * fVar97;
        auVar107._12_4_ = auVar226._12_4_ * fVar98;
        auVar82 = vfmadd213ps_fma(auVar192,(undefined1  [16])vVar13.field_0,auVar107);
        auVar157 = vfmadd213ps_fma(auVar191,(undefined1  [16])vVar12.field_0,auVar82);
        auVar82 = vrcpps_avx(auVar81);
        auVar215._8_4_ = 0x3f800000;
        auVar215._0_8_ = 0x3f8000003f800000;
        auVar215._12_4_ = 0x3f800000;
        auVar190 = vfnmadd213ps_fma(auVar82,auVar81,auVar215);
        auVar82 = vfmadd132ps_fma(auVar190,auVar82,auVar82);
        auVar108._0_4_ = (auVar157._0_4_ + auVar157._0_4_) * auVar82._0_4_;
        auVar108._4_4_ = (auVar157._4_4_ + auVar157._4_4_) * auVar82._4_4_;
        auVar108._8_4_ = (auVar157._8_4_ + auVar157._8_4_) * auVar82._8_4_;
        auVar108._12_4_ = (auVar157._12_4_ + auVar157._12_4_) * auVar82._12_4_;
        auVar82 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar108,2);
        auVar157 = vcmpps_avx(auVar108,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar82 = vandps_avx(auVar82,auVar157);
        uVar55 = CONCAT44(auVar81._4_4_,auVar81._0_4_);
        auVar156._0_8_ = uVar55 ^ 0x8000000080000000;
        auVar156._8_4_ = -auVar81._8_4_;
        auVar156._12_4_ = -auVar81._12_4_;
        auVar157 = vcmpps_avx(auVar81,auVar156,4);
        auVar82 = vandps_avx(auVar157,auVar82);
        auVar146 = vandps_avx(auVar146,auVar101);
        auVar82 = vpslld_avx(auVar82,0x1f);
        auVar157 = vpsrad_avx(auVar82,0x1f);
        auVar82 = auVar146 & auVar157;
        if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar82[0xf] < '\0') {
          auVar146 = vandps_avx(auVar157,auVar146);
          uVar3 = pGVar10->mask;
          auVar83._4_4_ = uVar3;
          auVar83._0_4_ = uVar3;
          auVar83._8_4_ = uVar3;
          auVar83._12_4_ = uVar3;
          auVar82 = vpand_avx(auVar83,*(undefined1 (*) [16])(ray + 0x90));
          auVar82 = vpcmpeqd_avx(auVar82,_DAT_01f45a50);
          auVar157 = auVar146 & ~auVar82;
          if ((((auVar157 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar157 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar157 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar157[0xf] < '\0') {
            auVar146 = vandnps_avx(auVar82,auVar146);
            pRVar58 = context->args;
            if ((pRVar58->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar82 = vrcpps_avx(auVar208);
              auVar218._8_4_ = 0x3f800000;
              auVar218._0_8_ = 0x3f8000003f800000;
              auVar218._12_4_ = 0x3f800000;
              auVar157 = vfnmadd213ps_fma(auVar208,auVar82,auVar218);
              auVar82 = vfmadd132ps_fma(auVar157,auVar82,auVar82);
              auVar90._8_4_ = 0x219392ef;
              auVar90._0_8_ = 0x219392ef219392ef;
              auVar90._12_4_ = 0x219392ef;
              auVar163 = vcmpps_avx(auVar163,auVar90,5);
              auVar163 = vandps_avx(auVar163,auVar82);
              auVar144._0_4_ = auVar163._0_4_ * auVar71._0_4_;
              auVar144._4_4_ = auVar163._4_4_ * auVar71._4_4_;
              auVar144._8_4_ = auVar163._8_4_ * auVar71._8_4_;
              auVar144._12_4_ = auVar163._12_4_ * auVar71._12_4_;
              auVar82 = vminps_avx(auVar144,auVar218);
              auVar91._0_4_ = auVar163._0_4_ * auVar72._0_4_;
              auVar91._4_4_ = auVar163._4_4_ * auVar72._4_4_;
              auVar91._8_4_ = auVar163._8_4_ * auVar72._8_4_;
              auVar91._12_4_ = auVar163._12_4_ * auVar72._12_4_;
              auVar163 = vminps_avx(auVar91,auVar218);
              auVar157 = vsubps_avx(auVar218,auVar82);
              auVar190 = vsubps_avx(auVar218,auVar163);
              auVar20._8_8_ = uVar23;
              auVar20._0_8_ = uVar22;
              vblendvps_avx(auVar82,auVar157,auVar20);
              vblendvps_avx(auVar163,auVar190,auVar20);
              p1.field_0._0_8_ = &itime;
              p1.field_0._8_8_ = &t;
              p1.field_0._16_8_ = &v_1;
              p1.field_0._24_8_ = &u;
              p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar12.field_0;
              p0.field_0.field_0.y.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar13.field_0;
              p0.field_0._32_16_ = auVar226;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                 *)&p0);
              p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
              p0.field_0._24_8_ = uStack_36c0;
              p0.field_0._16_8_ = local_36c8;
              p0.field_0._40_8_ = uStack_36b0;
              p0.field_0._32_8_ = uStack_36b8;
              auVar95 = ZEXT1632(CONCAT412(uVar52,CONCAT48(uVar52,CONCAT44(uVar52,uVar52))));
              vpcmpeqd_avx2(auVar95,auVar95);
              local_3868 = *(undefined1 (*) [16])(ray + 0x80);
              auVar163 = vblendvps_avx(local_3868,(undefined1  [16])t.field_0,auVar146);
              *(undefined1 (*) [16])(ray + 0x80) = auVar163;
              p1.field_0._0_8_ = local_3898;
              p1.field_0._8_8_ = pGVar10->userPtr;
              p1.field_0._16_8_ = context->user;
              p1.field_0._32_8_ = &p0;
              p1.field_0._40_4_ = 4;
              p1.field_0._24_8_ = ray;
              local_3898 = auVar146;
              if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar10->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
              }
              if (local_3898 == (undefined1  [16])0x0) {
                auVar163 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar163 = auVar163 ^ _DAT_01f46b70;
              }
              else {
                p_Var11 = context->args->filter;
                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var11)((RTCFilterFunctionNArguments *)&p1);
                }
                auVar146 = vpcmpeqd_avx(local_3898,_DAT_01f45a50);
                auVar163 = auVar146 ^ _DAT_01f46b70;
                auVar145._8_4_ = 0xff800000;
                auVar145._0_8_ = 0xff800000ff800000;
                auVar145._12_4_ = 0xff800000;
                auVar146 = vblendvps_avx(auVar145,*(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),
                                         auVar146);
                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar146;
              }
              auVar163 = vpslld_avx(auVar163,0x1f);
              auVar146 = vpsrad_avx(auVar163,0x1f);
              auVar4._0_4_ = local_3880->flags;
              auVar4._4_4_ = local_3880->feature_mask;
              auVar4._8_8_ = local_3880->context;
              auVar163 = vblendvps_avx(local_3868,auVar4,auVar163);
              local_3880->flags = auVar163._0_4_;
              local_3880->feature_mask = auVar163._4_4_;
              local_3880->context = (RTCRayQueryContext *)auVar163._8_8_;
              pRVar58 = local_3880;
            }
            auVar101 = vpandn_avx(auVar146,auVar101);
          }
        }
      }
      if ((((auVar101 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar101 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar101 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar101[0xf]
         ) {
        auVar252 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        break;
      }
      auVar163 = *(undefined1 (*) [16])ray;
      auVar146 = *(undefined1 (*) [16])(ray + 0x10);
      auVar82 = *(undefined1 (*) [16])(ray + 0x20);
      auVar191 = vsubps_avx(_local_3778,auVar163);
      auVar192 = vsubps_avx(_local_3758,auVar146);
      local_3868 = vsubps_avx(_local_3768,auVar82);
      auVar157 = vsubps_avx(auVar112,auVar163);
      auVar190 = vsubps_avx(auVar233,auVar146);
      auVar226 = vsubps_avx(auVar255,auVar82);
      auVar227 = vsubps_avx(_local_38a8,auVar163);
      auVar245 = vsubps_avx(_local_38c8,auVar146);
      auVar82 = vsubps_avx(_local_3938,auVar82);
      auVar69 = vsubps_avx(auVar227,auVar191);
      auVar70 = vsubps_avx(auVar245,auVar192);
      auVar128 = vsubps_avx(auVar82,local_3868);
      auVar109._0_4_ = auVar227._0_4_ + auVar191._0_4_;
      auVar109._4_4_ = auVar227._4_4_ + auVar191._4_4_;
      auVar109._8_4_ = auVar227._8_4_ + auVar191._8_4_;
      auVar109._12_4_ = auVar227._12_4_ + auVar191._12_4_;
      auVar223._0_4_ = auVar192._0_4_ + auVar245._0_4_;
      auVar223._4_4_ = auVar192._4_4_ + auVar245._4_4_;
      auVar223._8_4_ = auVar192._8_4_ + auVar245._8_4_;
      auVar223._12_4_ = auVar192._12_4_ + auVar245._12_4_;
      fVar68 = local_3868._0_4_;
      auVar235._0_4_ = auVar82._0_4_ + fVar68;
      fVar96 = local_3868._4_4_;
      auVar235._4_4_ = auVar82._4_4_ + fVar96;
      fVar97 = local_3868._8_4_;
      auVar235._8_4_ = auVar82._8_4_ + fVar97;
      fVar98 = local_3868._12_4_;
      auVar235._12_4_ = auVar82._12_4_ + fVar98;
      auVar250._0_4_ = auVar223._0_4_ * auVar128._0_4_;
      auVar250._4_4_ = auVar223._4_4_ * auVar128._4_4_;
      auVar250._8_4_ = auVar223._8_4_ * auVar128._8_4_;
      auVar250._12_4_ = auVar223._12_4_ * auVar128._12_4_;
      auVar111 = vfmsub231ps_fma(auVar250,auVar70,auVar235);
      auVar249._0_4_ = auVar235._0_4_ * auVar69._0_4_;
      auVar249._4_4_ = auVar235._4_4_ * auVar69._4_4_;
      auVar249._8_4_ = auVar235._8_4_ * auVar69._8_4_;
      auVar249._12_4_ = auVar235._12_4_ * auVar69._12_4_;
      auVar146 = vfmsub231ps_fma(auVar249,auVar128,auVar109);
      auVar110._0_4_ = auVar109._0_4_ * auVar70._0_4_;
      auVar110._4_4_ = auVar109._4_4_ * auVar70._4_4_;
      auVar110._8_4_ = auVar109._8_4_ * auVar70._8_4_;
      auVar110._12_4_ = auVar109._12_4_ * auVar70._12_4_;
      auVar163 = vfmsub231ps_fma(auVar110,auVar69,auVar223);
      fVar186 = *(float *)(ray + 0x60);
      fVar187 = *(float *)(ray + 100);
      fVar188 = *(float *)(ray + 0x68);
      auVar21 = *(undefined1 (*) [12])(ray + 0x60);
      fVar189 = *(float *)(ray + 0x6c);
      auVar236._0_4_ = fVar186 * auVar163._0_4_;
      auVar236._4_4_ = fVar187 * auVar163._4_4_;
      auVar236._8_4_ = fVar188 * auVar163._8_4_;
      auVar236._12_4_ = fVar189 * auVar163._12_4_;
      auVar163 = *(undefined1 (*) [16])(ray + 0x50);
      auVar129 = vfmadd231ps_fma(auVar236,auVar163,auVar146);
      auVar146 = *(undefined1 (*) [16])(ray + 0x40);
      auVar112 = vfmadd231ps_fma(auVar129,auVar146,auVar111);
      auVar129 = vsubps_avx(auVar192,auVar190);
      auVar111 = vsubps_avx(local_3868,auVar226);
      auVar137._0_4_ = auVar192._0_4_ + auVar190._0_4_;
      auVar137._4_4_ = auVar192._4_4_ + auVar190._4_4_;
      auVar137._8_4_ = auVar192._8_4_ + auVar190._8_4_;
      auVar137._12_4_ = auVar192._12_4_ + auVar190._12_4_;
      auVar224._0_4_ = fVar68 + auVar226._0_4_;
      auVar224._4_4_ = fVar96 + auVar226._4_4_;
      auVar224._8_4_ = fVar97 + auVar226._8_4_;
      auVar224._12_4_ = fVar98 + auVar226._12_4_;
      fVar99 = auVar111._0_4_;
      auVar158._0_4_ = auVar137._0_4_ * fVar99;
      fVar119 = auVar111._4_4_;
      auVar158._4_4_ = auVar137._4_4_ * fVar119;
      fVar167 = auVar111._8_4_;
      auVar158._8_4_ = auVar137._8_4_ * fVar167;
      fVar170 = auVar111._12_4_;
      auVar158._12_4_ = auVar137._12_4_ * fVar170;
      auVar233 = vfmsub231ps_fma(auVar158,auVar129,auVar224);
      auVar244 = vsubps_avx(auVar191,auVar157);
      fVar115 = auVar244._0_4_;
      auVar225._0_4_ = auVar224._0_4_ * fVar115;
      fVar149 = auVar244._4_4_;
      auVar225._4_4_ = auVar224._4_4_ * fVar149;
      fVar168 = auVar244._8_4_;
      auVar225._8_4_ = auVar224._8_4_ * fVar168;
      fVar184 = auVar244._12_4_;
      auVar225._12_4_ = auVar224._12_4_ * fVar184;
      auVar216._0_4_ = auVar191._0_4_ + auVar157._0_4_;
      auVar216._4_4_ = auVar191._4_4_ + auVar157._4_4_;
      auVar216._8_4_ = auVar191._8_4_ + auVar157._8_4_;
      auVar216._12_4_ = auVar191._12_4_ + auVar157._12_4_;
      auVar183 = vfmsub231ps_fma(auVar225,auVar111,auVar216);
      fVar117 = auVar129._0_4_;
      auVar217._0_4_ = auVar216._0_4_ * fVar117;
      fVar166 = auVar129._4_4_;
      auVar217._4_4_ = auVar216._4_4_ * fVar166;
      fVar169 = auVar129._8_4_;
      auVar217._8_4_ = auVar216._8_4_ * fVar169;
      fVar185 = auVar129._12_4_;
      auVar217._12_4_ = auVar216._12_4_ * fVar185;
      auVar255 = vfmsub231ps_fma(auVar217,auVar244,auVar137);
      auVar251._0_4_ = fVar186 * auVar255._0_4_;
      auVar251._4_4_ = fVar187 * auVar255._4_4_;
      auVar251._8_4_ = fVar188 * auVar255._8_4_;
      auVar251._12_4_ = fVar189 * auVar255._12_4_;
      auVar183 = vfmadd231ps_fma(auVar251,auVar163,auVar183);
      auVar233 = vfmadd231ps_fma(auVar183,auVar146,auVar233);
      auVar183 = vsubps_avx(auVar157,auVar227);
      auVar138._0_4_ = auVar227._0_4_ + auVar157._0_4_;
      auVar138._4_4_ = auVar227._4_4_ + auVar157._4_4_;
      auVar138._8_4_ = auVar227._8_4_ + auVar157._8_4_;
      auVar138._12_4_ = auVar227._12_4_ + auVar157._12_4_;
      auVar227 = vsubps_avx(auVar190,auVar245);
      auVar159._0_4_ = auVar190._0_4_ + auVar245._0_4_;
      auVar159._4_4_ = auVar190._4_4_ + auVar245._4_4_;
      auVar159._8_4_ = auVar190._8_4_ + auVar245._8_4_;
      auVar159._12_4_ = auVar190._12_4_ + auVar245._12_4_;
      auVar245 = vsubps_avx(auVar226,auVar82);
      auVar84._0_4_ = auVar226._0_4_ + auVar82._0_4_;
      auVar84._4_4_ = auVar226._4_4_ + auVar82._4_4_;
      auVar84._8_4_ = auVar226._8_4_ + auVar82._8_4_;
      auVar84._12_4_ = auVar226._12_4_ + auVar82._12_4_;
      auVar178._0_4_ = auVar245._0_4_ * auVar159._0_4_;
      auVar178._4_4_ = auVar245._4_4_ * auVar159._4_4_;
      auVar178._8_4_ = auVar245._8_4_ * auVar159._8_4_;
      auVar178._12_4_ = auVar245._12_4_ * auVar159._12_4_;
      auVar157 = vfmsub231ps_fma(auVar178,auVar227,auVar84);
      auVar85._0_4_ = auVar183._0_4_ * auVar84._0_4_;
      auVar85._4_4_ = auVar183._4_4_ * auVar84._4_4_;
      auVar85._8_4_ = auVar183._8_4_ * auVar84._8_4_;
      auVar85._12_4_ = auVar183._12_4_ * auVar84._12_4_;
      auVar82 = vfmsub231ps_fma(auVar85,auVar245,auVar138);
      auVar139._0_4_ = auVar138._0_4_ * auVar227._0_4_;
      auVar139._4_4_ = auVar138._4_4_ * auVar227._4_4_;
      auVar139._8_4_ = auVar138._8_4_ * auVar227._8_4_;
      auVar139._12_4_ = auVar138._12_4_ * auVar227._12_4_;
      auVar190 = vfmsub231ps_fma(auVar139,auVar183,auVar159);
      auVar140._0_4_ = fVar186 * auVar190._0_4_;
      auVar140._4_4_ = fVar187 * auVar190._4_4_;
      auVar140._8_4_ = fVar188 * auVar190._8_4_;
      auVar140._12_4_ = fVar189 * auVar190._12_4_;
      auVar82 = vfmadd231ps_fma(auVar140,auVar163,auVar82);
      auVar226 = vfmadd231ps_fma(auVar82,auVar146,auVar157);
      auVar200._0_4_ = auVar226._0_4_ + auVar112._0_4_ + auVar233._0_4_;
      auVar200._4_4_ = auVar226._4_4_ + auVar112._4_4_ + auVar233._4_4_;
      auVar200._8_4_ = auVar226._8_4_ + auVar112._8_4_ + auVar233._8_4_;
      auVar200._12_4_ = auVar226._12_4_ + auVar112._12_4_ + auVar233._12_4_;
      auVar82 = vminps_avx(auVar112,auVar233);
      auVar157 = vminps_avx(auVar82,auVar226);
      auVar82 = vandps_avx(auVar240,auVar200);
      auVar160._0_4_ = auVar82._0_4_ * 1.1920929e-07;
      auVar160._4_4_ = auVar82._4_4_ * 1.1920929e-07;
      auVar160._8_4_ = auVar82._8_4_ * 1.1920929e-07;
      auVar160._12_4_ = auVar82._12_4_ * 1.1920929e-07;
      auVar179._0_4_ = local_3858._0_4_ ^ (uint)auVar160._0_4_;
      auVar179._4_4_ = local_3858._4_4_ ^ (uint)auVar160._4_4_;
      auVar179._8_4_ = local_3858._8_4_ ^ (uint)auVar160._8_4_;
      auVar179._12_4_ = local_3858._12_4_ ^ (uint)auVar160._12_4_;
      auVar157 = vcmpps_avx(auVar157,auVar179,5);
      auVar190 = vmaxps_avx(auVar112,auVar233);
      auVar190 = vmaxps_avx(auVar190,auVar226);
      auVar190 = vcmpps_avx(auVar190,auVar160,2);
      auVar157 = vorps_avx(auVar157,auVar190);
      auVar190 = auVar101 & auVar157;
      if ((((auVar190 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar190 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar190 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar190[0xf]
         ) {
        auVar252 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar114 = ZEXT1664(auVar101);
      }
      else {
        auVar86._0_4_ = fVar117 * auVar128._0_4_;
        auVar86._4_4_ = fVar166 * auVar128._4_4_;
        auVar86._8_4_ = fVar169 * auVar128._8_4_;
        auVar86._12_4_ = fVar185 * auVar128._12_4_;
        auVar141._0_4_ = fVar115 * auVar70._0_4_;
        auVar141._4_4_ = fVar149 * auVar70._4_4_;
        auVar141._8_4_ = fVar168 * auVar70._8_4_;
        auVar141._12_4_ = fVar184 * auVar70._12_4_;
        auVar70 = vfmsub213ps_fma(auVar70,auVar111,auVar86);
        auVar161._0_4_ = fVar99 * auVar227._0_4_;
        auVar161._4_4_ = fVar119 * auVar227._4_4_;
        auVar161._8_4_ = fVar167 * auVar227._8_4_;
        auVar161._12_4_ = fVar170 * auVar227._12_4_;
        auVar180._0_4_ = fVar115 * auVar245._0_4_;
        auVar180._4_4_ = fVar149 * auVar245._4_4_;
        auVar180._8_4_ = fVar168 * auVar245._8_4_;
        auVar180._12_4_ = fVar184 * auVar245._12_4_;
        auVar245 = vfmsub213ps_fma(auVar245,auVar129,auVar161);
        auVar190 = vandps_avx(auVar240,auVar86);
        auVar226 = vandps_avx(auVar240,auVar161);
        auVar190 = vcmpps_avx(auVar190,auVar226,1);
        vVar12.field_0 =
             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar245,auVar70,auVar190)
        ;
        auVar87._0_4_ = auVar183._0_4_ * fVar117;
        auVar87._4_4_ = auVar183._4_4_ * fVar166;
        auVar87._8_4_ = auVar183._8_4_ * fVar169;
        auVar87._12_4_ = auVar183._12_4_ * fVar185;
        auVar245 = vfmsub213ps_fma(auVar183,auVar111,auVar180);
        auVar162._0_4_ = fVar99 * auVar69._0_4_;
        auVar162._4_4_ = fVar119 * auVar69._4_4_;
        auVar162._8_4_ = fVar167 * auVar69._8_4_;
        auVar162._12_4_ = fVar170 * auVar69._12_4_;
        auVar70 = vfmsub213ps_fma(auVar128,auVar244,auVar162);
        auVar190 = vandps_avx(auVar240,auVar162);
        auVar226 = vandps_avx(auVar240,auVar180);
        auVar190 = vcmpps_avx(auVar190,auVar226,1);
        vVar13.field_0 =
             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar245,auVar70,auVar190)
        ;
        auVar245 = vfmsub213ps_fma(auVar69,auVar129,auVar141);
        auVar227 = vfmsub213ps_fma(auVar227,auVar244,auVar87);
        auVar190 = vandps_avx(auVar240,auVar141);
        auVar226 = vandps_avx(auVar240,auVar87);
        auVar190 = vcmpps_avx(auVar190,auVar226,1);
        auVar190 = vblendvps_avx(auVar227,auVar245,auVar190);
        local_38c8._0_4_ = auVar21._0_4_;
        local_38c8._4_4_ = auVar21._4_4_;
        fStack_38c0 = auVar21._8_4_;
        auVar88._0_4_ = auVar190._0_4_ * (float)local_38c8._0_4_;
        auVar88._4_4_ = auVar190._4_4_ * (float)local_38c8._4_4_;
        auVar88._8_4_ = auVar190._8_4_ * fStack_38c0;
        auVar88._12_4_ = auVar190._12_4_ * fVar189;
        auVar163 = vfmadd213ps_fma(auVar163,(undefined1  [16])vVar13.field_0,auVar88);
        auVar163 = vfmadd213ps_fma(auVar146,(undefined1  [16])vVar12.field_0,auVar163);
        auVar89._0_4_ = auVar163._0_4_ + auVar163._0_4_;
        auVar89._4_4_ = auVar163._4_4_ + auVar163._4_4_;
        auVar89._8_4_ = auVar163._8_4_ + auVar163._8_4_;
        auVar89._12_4_ = auVar163._12_4_ + auVar163._12_4_;
        auVar142._0_4_ = auVar190._0_4_ * fVar68;
        auVar142._4_4_ = auVar190._4_4_ * fVar96;
        auVar142._8_4_ = auVar190._8_4_ * fVar97;
        auVar142._12_4_ = auVar190._12_4_ * fVar98;
        auVar163 = vfmadd213ps_fma(auVar192,(undefined1  [16])vVar13.field_0,auVar142);
        auVar146 = vfmadd213ps_fma(auVar191,(undefined1  [16])vVar12.field_0,auVar163);
        auVar163 = vrcpps_avx(auVar89);
        auVar209._8_4_ = 0x3f800000;
        auVar209._0_8_ = 0x3f8000003f800000;
        auVar209._12_4_ = 0x3f800000;
        auVar191 = vfnmadd213ps_fma(auVar163,auVar89,auVar209);
        auVar163 = vfmadd132ps_fma(auVar191,auVar163,auVar163);
        auVar143._0_4_ = (auVar146._0_4_ + auVar146._0_4_) * auVar163._0_4_;
        auVar143._4_4_ = (auVar146._4_4_ + auVar146._4_4_) * auVar163._4_4_;
        auVar143._8_4_ = (auVar146._8_4_ + auVar146._8_4_) * auVar163._8_4_;
        auVar143._12_4_ = (auVar146._12_4_ + auVar146._12_4_) * auVar163._12_4_;
        auVar163 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar143,2);
        auVar146 = vcmpps_avx(auVar143,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar163 = vandps_avx(auVar163,auVar146);
        auVar181._0_4_ = local_3858._0_4_ ^ (uint)auVar89._0_4_;
        auVar181._4_4_ = local_3858._4_4_ ^ (uint)auVar89._4_4_;
        auVar181._8_4_ = local_3858._8_4_ ^ (uint)auVar89._8_4_;
        auVar181._12_4_ = local_3858._12_4_ ^ (uint)auVar89._12_4_;
        auVar146 = vcmpps_avx(auVar89,auVar181,4);
        auVar163 = vandps_avx(auVar146,auVar163);
        auVar146 = vandps_avx(auVar101,auVar157);
        auVar163 = vpslld_avx(auVar163,0x1f);
        auVar157 = vpsrad_avx(auVar163,0x1f);
        auVar163 = auVar146 & auVar157;
        auVar114 = ZEXT1664(auVar101);
        if ((((auVar163 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar163 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar163 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < auVar163[0xf]) {
          auVar252 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        }
        else {
          auVar163 = vandps_avx(auVar157,auVar146);
          uVar52 = *(uint *)(lVar61 + 0x40 + lVar65 * 4);
          pRVar58 = (RTCIntersectArguments *)(context->scene->geometries).items;
          lVar62 = *(long *)(&pRVar58->flags + (ulong)uVar52 * 2);
          uVar53 = *(undefined4 *)(lVar62 + 0x34);
          auVar164._4_4_ = uVar53;
          auVar164._0_4_ = uVar53;
          auVar164._8_4_ = uVar53;
          auVar164._12_4_ = uVar53;
          auVar146 = vpand_avx(auVar164,*(undefined1 (*) [16])(ray + 0x90));
          auVar146 = vpcmpeqd_avx(auVar146,_DAT_01f45a50);
          auVar157 = auVar163 & ~auVar146;
          auVar252 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar157 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar157 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar157 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar157[0xf] < '\0') {
            auVar163 = vandnps_avx(auVar146,auVar163);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pRVar58 = context->args, *(long *)(lVar62 + 0x48) != 0)) {
              auVar146 = vrcpps_avx(auVar200);
              auVar182._8_4_ = 0x3f800000;
              auVar182._0_8_ = 0x3f8000003f800000;
              auVar182._12_4_ = 0x3f800000;
              auVar157 = vfnmadd213ps_fma(auVar200,auVar146,auVar182);
              auVar157 = vfmadd132ps_fma(auVar157,auVar146,auVar146);
              auVar92._8_4_ = 0x219392ef;
              auVar92._0_8_ = 0x219392ef219392ef;
              auVar92._12_4_ = 0x219392ef;
              auVar146 = vcmpps_avx(auVar82,auVar92,5);
              auVar146 = vandps_avx(auVar146,auVar157);
              auVar165._0_4_ = auVar146._0_4_ * auVar112._0_4_;
              auVar165._4_4_ = auVar146._4_4_ * auVar112._4_4_;
              auVar165._8_4_ = auVar146._8_4_ * auVar112._8_4_;
              auVar165._12_4_ = auVar146._12_4_ * auVar112._12_4_;
              auVar82 = vminps_avx(auVar165,auVar182);
              auVar93._0_4_ = auVar146._0_4_ * auVar233._0_4_;
              auVar93._4_4_ = auVar146._4_4_ * auVar233._4_4_;
              auVar93._8_4_ = auVar146._8_4_ * auVar233._8_4_;
              auVar93._12_4_ = auVar146._12_4_ * auVar233._12_4_;
              auVar146 = vminps_avx(auVar93,auVar182);
              auVar157 = vsubps_avx(auVar182,auVar82);
              auVar191 = vsubps_avx(auVar182,auVar146);
              auVar19._8_8_ = uVar25;
              auVar19._0_8_ = uVar24;
              vblendvps_avx(auVar82,auVar157,auVar19);
              vblendvps_avx(auVar146,auVar191,auVar19);
              p1.field_0._0_8_ = &itime;
              p1.field_0._8_8_ = &t;
              p1.field_0._16_8_ = &v_1;
              p1.field_0._24_8_ = &u;
              p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar12.field_0;
              p0.field_0.field_0.y.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar13.field_0;
              p0.field_0._32_16_ = auVar190;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                 *)&p0);
              p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
              p0.field_0._24_8_ = uStack_36c0;
              p0.field_0._16_8_ = local_36c8;
              p0.field_0._40_8_ = uStack_36b0;
              p0.field_0._32_8_ = uStack_36b8;
              auVar95 = ZEXT1632(CONCAT412(uVar52,CONCAT48(uVar52,CONCAT44(uVar52,uVar52))));
              vpcmpeqd_avx2(auVar95,auVar95);
              auVar146 = *(undefined1 (*) [16])(ray + 0x80);
              auVar82 = vblendvps_avx(auVar146,(undefined1  [16])t.field_0,auVar163);
              *(undefined1 (*) [16])(ray + 0x80) = auVar82;
              p1.field_0._0_8_ = local_3898;
              p1.field_0._8_8_ = *(undefined8 *)(lVar62 + 0x18);
              p1.field_0._16_8_ = context->user;
              p1.field_0._32_8_ = &p0;
              p1.field_0._40_4_ = 4;
              p1.field_0._24_8_ = ray;
              local_3898 = auVar163;
              if (*(code **)(lVar62 + 0x48) != (code *)0x0) {
                (**(code **)(lVar62 + 0x48))(&p1);
              }
              if (local_3898 == (undefined1  [16])0x0) {
                auVar163 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar163 = auVar163 ^ _DAT_01f46b70;
                auVar252 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              else {
                p_Var11 = context->args->filter;
                if (p_Var11 == (RTCFilterFunctionN)0x0) {
                  auVar252 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
                else {
                  auVar252 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || ((*(byte *)(lVar62 + 0x3e) & 0x40) != 0)) {
                    (*p_Var11)((RTCFilterFunctionNArguments *)&p1);
                    auVar252 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                 ));
                  }
                }
                auVar82 = vpcmpeqd_avx(local_3898,_DAT_01f45a50);
                auVar163 = auVar82 ^ _DAT_01f46b70;
                auVar147._8_4_ = 0xff800000;
                auVar147._0_8_ = 0xff800000ff800000;
                auVar147._12_4_ = 0xff800000;
                auVar82 = vblendvps_avx(auVar147,*(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),
                                        auVar82);
                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar82;
              }
              auVar82 = vpslld_avx(auVar163,0x1f);
              auVar163 = vpsrad_avx(auVar82,0x1f);
              auVar5._0_4_ = local_3880->flags;
              auVar5._4_4_ = local_3880->feature_mask;
              auVar5._8_8_ = local_3880->context;
              auVar146 = vblendvps_avx(auVar146,auVar5,auVar82);
              local_3880->flags = auVar146._0_4_;
              local_3880->feature_mask = auVar146._4_4_;
              local_3880->context = (RTCRayQueryContext *)auVar146._8_8_;
              pRVar58 = local_3880;
            }
            auVar163 = vpandn_avx(auVar163,auVar101);
            auVar114 = ZEXT1664(auVar163);
          }
        }
      }
      lVar65 = lVar65 + 1;
      auVar101 = auVar114._0_16_;
    } while ((((auVar101 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar101 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar101 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar114[0xf] < '\0');
    auVar114 = ZEXT1664(local_37a8);
    auVar146 = vandps_avx(auVar101,local_37a8);
    pRVar59 = (RTCIntersectArguments *)((long)&local_3878->flags + 1);
    auVar101 = local_37a8 & auVar101;
    auVar163 = local_37a8;
    local_37a8 = auVar146;
  } while ((((auVar101 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar101 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar101 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar101[0xf] < '\0');
  auVar163 = vpcmpeqd_avx(auVar163,auVar163);
  auVar94._0_4_ = local_37a8._0_4_ ^ auVar163._0_4_;
  auVar94._4_4_ = local_37a8._4_4_ ^ auVar163._4_4_;
  auVar94._8_4_ = local_37a8._8_4_ ^ auVar163._8_4_;
  auVar94._12_4_ = local_37a8._12_4_ ^ auVar163._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar94,(undefined1  [16])terminated.field_0);
  auVar163 = auVar163 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar163 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar163 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar163 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar163[0xf])
  goto LAB_0164427c;
  auVar114 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar148._8_4_ = 0xff800000;
  auVar148._0_8_ = 0xff800000ff800000;
  auVar148._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar148,
                     (undefined1  [16])terminated.field_0);
  goto LAB_0164284b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }